

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O1

ST2052_TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::OpenRead(ST2052_TextParser *this,string *filename)

{
  h__TextParser *phVar1;
  h__TextParser *this_00;
  
  this_00 = (h__TextParser *)operator_new(400);
  h__TextParser::h__TextParser(this_00);
  phVar1 = (h__TextParser *)filename->_M_string_length;
  if (phVar1 != (h__TextParser *)0x0) {
    h__TextParser::~h__TextParser(phVar1);
    operator_delete(phVar1,400);
  }
  filename->_M_string_length = (size_type)this_00;
  h__TextParser::OpenRead((h__TextParser *)this,(string *)this_00);
  if (*(int *)&this->_vptr_ST2052_TextParser < 0) {
    phVar1 = (h__TextParser *)filename->_M_string_length;
    if (phVar1 != (h__TextParser *)0x0) {
      h__TextParser::~h__TextParser(phVar1);
      operator_delete(phVar1,400);
    }
    filename->_M_string_length = 0;
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::ST2052_TextParser::OpenRead(const std::string& filename) const
{
  const_cast<AS_02::TimedText::ST2052_TextParser*>(this)->m_Parser = new h__TextParser;

  Result_t result = m_Parser->OpenRead(filename);

  if ( ASDCP_FAILURE(result) )
    const_cast<AS_02::TimedText::ST2052_TextParser*>(this)->m_Parser = 0;

  return result;
}